

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianPoint::~IfcCartesianPoint(IfcCartesianPoint *this)

{
  void *pvVar1;
  
  (this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcCartesianPoint_00946b00;
  *(undefined ***)&this->field_0x58 = &PTR__IfcCartesianPoint_00946ba0;
  *(undefined ***)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcCartesianPoint_00946b28;
  *(undefined ***)
   &(this->super_IfcPoint).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcCartesianPoint_00946b50;
  *(undefined ***)&(this->super_IfcPoint).super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcCartesianPoint_00946b78;
  pvVar1 = *(void **)&(this->super_IfcPoint).field_0x40;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&this->field_0x50 - (long)pvVar1);
  }
  operator_delete(this,0x70);
  return;
}

Assistant:

IfcCartesianPoint() : Object("IfcCartesianPoint") {}